

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.cpp
# Opt level: O3

Token * __thiscall EOPlus::Lexer::ReadSymbol(Token *__return_storage_ptr__,Lexer *this)

{
  bool bVar1;
  char c;
  char local_d9;
  string local_d8;
  function<bool_(char)> local_b8;
  variant local_98;
  variant local_58;
  
  local_d9 = '\0';
  local_b8.super__Function_base._M_functor._8_8_ = 0;
  local_b8.super__Function_base._M_functor._M_unused._M_object = ctype_symbol;
  local_b8._M_invoker = std::_Function_handler<bool_(char),_bool_(*)(char)>::_M_invoke;
  local_b8.super__Function_base._M_manager =
       std::_Function_handler<bool_(char),_bool_(*)(char)>::_M_manager;
  bVar1 = GetCharIf(this,&local_d9,&local_b8);
  if (local_b8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_b8.super__Function_base._M_manager)
              ((_Any_data *)&local_b8,(_Any_data *)&local_b8,__destroy_functor);
  }
  if (bVar1) {
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_d8,'\x01');
    util::variant::variant(&local_98,&local_d8);
    __return_storage_ptr__->type = Symbol;
    (__return_storage_ptr__->data).val_int = local_98.val_int;
    *(undefined4 *)&(__return_storage_ptr__->data).field_0x4 = local_98._4_4_;
    *(undefined4 *)&(__return_storage_ptr__->data).val_float = local_98.val_float._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->data).val_float + 4) = local_98.val_float._4_4_;
    (__return_storage_ptr__->data).val_string._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->data).val_string.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&(__return_storage_ptr__->data).val_string,
               local_98.val_string._M_dataplus._M_p,
               local_98.val_string._M_dataplus._M_p + local_98.val_string._M_string_length);
    (__return_storage_ptr__->data).type = local_98.type;
    (__return_storage_ptr__->data).val_bool = local_98.val_bool;
    (__return_storage_ptr__->data).cache_val[0] = local_98.cache_val[0];
    (__return_storage_ptr__->data).cache_val[1] = local_98.cache_val[1];
    (__return_storage_ptr__->data).cache_val[2] = local_98.cache_val[2];
    (__return_storage_ptr__->data).cache_val[3] = local_98.cache_val[3];
    *(undefined3 *)&(__return_storage_ptr__->data).field_0x35 = local_98._53_3_;
    __return_storage_ptr__->newlines = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.val_string._M_dataplus._M_p != &local_98.val_string.field_2) {
      operator_delete(local_98.val_string._M_dataplus._M_p,
                      local_98.val_string.field_2._M_allocated_capacity + 1);
    }
    local_58.val_string.field_2._M_allocated_capacity = local_d8.field_2._M_allocated_capacity;
    local_58.val_string._M_dataplus._M_p = local_d8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p == &local_d8.field_2) {
      return __return_storage_ptr__;
    }
  }
  else {
    util::variant::variant(&local_58);
    __return_storage_ptr__->type = Invalid;
    (__return_storage_ptr__->data).val_int = local_58.val_int;
    *(undefined4 *)&(__return_storage_ptr__->data).field_0x4 = local_58._4_4_;
    *(undefined4 *)&(__return_storage_ptr__->data).val_float = local_58.val_float._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->data).val_float + 4) = local_58.val_float._4_4_;
    (__return_storage_ptr__->data).val_string._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->data).val_string.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&(__return_storage_ptr__->data).val_string,
               local_58.val_string._M_dataplus._M_p,
               local_58.val_string._M_dataplus._M_p + local_58.val_string._M_string_length);
    (__return_storage_ptr__->data).type = local_58.type;
    (__return_storage_ptr__->data).val_bool = local_58.val_bool;
    (__return_storage_ptr__->data).cache_val[0] = local_58.cache_val[0];
    (__return_storage_ptr__->data).cache_val[1] = local_58.cache_val[1];
    (__return_storage_ptr__->data).cache_val[2] = local_58.cache_val[2];
    (__return_storage_ptr__->data).cache_val[3] = local_58.cache_val[3];
    *(undefined3 *)&(__return_storage_ptr__->data).field_0x35 = local_58._53_3_;
    __return_storage_ptr__->newlines = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.val_string._M_dataplus._M_p == &local_58.val_string.field_2) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(local_58.val_string._M_dataplus._M_p,
                  local_58.val_string.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::ReadSymbol()
	{
		char c = '\0';

		if (!this->GetCharIf(c, ctype_symbol))
			return Token();

		return Token(Token::Symbol, std::string(1, c));
	}